

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_optimizer.hpp
# Opt level: O2

AST_Node_Impl_Ptr<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> __thiscall
chaiscript::optimizer::Return::
optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
          (Return *this,
          AST_Node_Impl_Ptr<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *p)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long *in_RDX;
  
  lVar3 = *in_RDX;
  if ((((*(int *)(lVar3 + 8) == 0xc) || (*(int *)(lVar3 + 8) == 9)) &&
      (*(long *)(lVar3 + 0x50) != *(long *)(lVar3 + 0x58))) &&
     (lVar1 = *(long *)(*(long *)(lVar3 + 0x58) + -8), *(int *)(lVar1 + 8) == 10)) {
    lVar1 = *(long *)(lVar1 + 0x58);
    lVar2 = *(long *)(lVar1 + -8);
    if ((*(int *)(lVar2 + 8) == 0x13) &&
       (*(long *)(lVar2 + 0x58) -
        (long)*(__uniq_ptr_impl<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                **)(lVar2 + 0x50) == 8)) {
      std::
      __uniq_ptr_impl<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
      ::operator=((__uniq_ptr_impl<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                   *)(lVar1 + -8),
                  *(__uniq_ptr_impl<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                    **)(lVar2 + 0x50));
      lVar3 = *in_RDX;
    }
  }
  *(long *)this = lVar3;
  *in_RDX = 0;
  return (__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
          )(__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
            )this;
}

Assistant:

auto optimize(eval::AST_Node_Impl_Ptr<T> p) {
        if ((p->identifier == AST_Node_Type::Def || p->identifier == AST_Node_Type::Lambda) && !p->children.empty()) {
          auto &last_child = p->children.back();
          if (last_child->identifier == AST_Node_Type::Block) {
            auto &block_last_child = last_child->children.back();
            if (block_last_child->identifier == AST_Node_Type::Return) {
              if (block_last_child->children.size() == 1) {
                last_child->children.back() = std::move(block_last_child->children[0]);
              }
            }
          }
        }

        return p;
      }